

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::BitState<unsigned_short>,short,duckdb::BitXorOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  BitState<unsigned_short> *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  short *rdata_1;
  BitState<unsigned_short> **sdata_1;
  AggregateFinalizeData finalize_data;
  short *rdata;
  BitState<unsigned_short> **sdata;
  short *in_stack_ffffffffffffff78;
  BitState<unsigned_short> *in_stack_ffffffffffffff80;
  BitState<unsigned_short> *state;
  AggregateFinalizeData local_78;
  short *local_60;
  BitState<unsigned_short> **local_58;
  AggregateFinalizeData local_50;
  short *local_38;
  BitState<unsigned_short> **local_30;
  long local_28;
  BitState<unsigned_short> *local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::GetData<duckdb::BitState<unsigned_short>*>((Vector *)0x98abb0);
    local_38 = ConstantVector::GetData<short>((Vector *)0x98abbf);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,local_10);
    BitwiseOperation::Finalize<short,duckdb::BitState<unsigned_short>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x98abef
              );
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_58 = FlatVector::GetData<duckdb::BitState<unsigned_short>*>((Vector *)0x98ac0d);
    local_60 = FlatVector::GetData<short>((Vector *)0x98ac1c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,local_18,local_10);
    for (state = (BitState<unsigned_short> *)0x0; state < local_20;
        state = (BitState<unsigned_short> *)&state->field_0x1) {
      local_78.result_idx = (idx_t)(&state->is_set + local_28);
      BitwiseOperation::Finalize<short,duckdb::BitState<unsigned_short>>
                (state,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x98ac81);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}